

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field)

{
  bool bVar1;
  char *in_RDX;
  string *in_RDI;
  string *name;
  bool in_stack_000000bd;
  bool in_stack_000000be;
  bool in_stack_000000bf;
  FieldDescriptor *in_stack_000000c0;
  GeneratorOptions *in_stack_000000c8;
  string *ident;
  string local_50 [48];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  ident = in_RDI;
  JSIdent_abi_cxx11_(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be,
                     in_stack_000000bd);
  bVar1 = anon_unknown_0::IsReserved(ident);
  if (bVar1) {
    std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    std::__cxx11::string::operator=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return ident;
}

Assistant:

std::string JSObjectFieldName(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ false,
                             /* is_map = */ false,
                             /* drop_list = */ false);
  if (IsReserved(name)) {
    name = "pb_" + name;
  }
  return name;
}